

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  Location pCVar1;
  bool bVar2;
  ushort uVar3;
  ValueHolder *pVVar4;
  ValueHolder VVar5;
  Value *pVVar6;
  Location pCVar7;
  undefined4 uVar8;
  bool bVar9;
  _Elt_pointer ppVVar10;
  undefined1 auVar11 [16];
  Value decoded;
  string decoded_string;
  ValueHolder local_68;
  ushort local_60;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar9 = decodeString(this,token,&local_40);
  if (bVar9) {
    Value::Value((Value *)&local_68,&local_40);
    uVar8 = _local_60;
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar4 = &ppVVar10[-1]->value_;
    bVar2 = pVVar4[1].bool_;
    pVVar4[1].bool_ = local_60._0_1_;
    _local_60 = CONCAT31(stack0xffffffffffffffa1,bVar2);
    VVar5 = *pVVar4;
    *pVVar4 = local_68;
    uVar3 = *(ushort *)(pVVar4 + 1);
    *(ushort *)(pVVar4 + 1) = uVar3 & 0xfeff | local_60 & 0x100;
    _local_60 = CONCAT22(SUB42(uVar8,2),local_60 & 0xfeff | uVar3 & 0x100);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar10 = ppVVar10 + -1;
    }
    pVVar6 = *ppVVar10;
    pCVar7 = token->end_;
    pCVar1 = this->begin_;
    auVar11._8_4_ = (int)pCVar1;
    auVar11._0_8_ = pCVar1;
    auVar11._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar6->start_ = (long)token->start_ - (long)pCVar1;
    pVVar6->limit_ = (long)pCVar7 - auVar11._8_8_;
    local_68 = VVar5;
    Value::~Value((Value *)&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar9;
}

Assistant:

bool Reader::decodeString(Token& token) {
  JSONCPP_STRING decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}